

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

curl_off_t Curl_creader_client_length(Curl_easy *data)

{
  curl_off_t cVar1;
  Curl_creader *pCVar2;
  
  pCVar2 = (data->req).reader_stack;
  while( true ) {
    if (pCVar2 == (Curl_creader *)0x0) {
      return -1;
    }
    if (pCVar2->phase == CURL_CR_CLIENT) break;
    pCVar2 = pCVar2->next;
  }
  cVar1 = (*pCVar2->crt->total_length)(data,pCVar2);
  return cVar1;
}

Assistant:

curl_off_t Curl_creader_client_length(struct Curl_easy *data)
{
  struct Curl_creader *r = data->req.reader_stack;
  while(r && r->phase != CURL_CR_CLIENT)
    r = r->next;
  return r ? r->crt->total_length(data, r) : -1;
}